

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacReporters.cpp
# Opt level: O2

void __thiscall ApprovalTests::Mac::DiffMergeReporter::DiffMergeReporter(DiffMergeReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Mac::DIFF_MERGE();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001bd128;
  return;
}

Assistant:

DiffMergeReporter::DiffMergeReporter()
            : GenericDiffReporter(DiffPrograms::Mac::DIFF_MERGE())
        {
        }